

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

int __thiscall
AbstractModuleClient::unsubscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  HighFreqDataType local_150;
  HighFreqDataType local_c0;
  
  pcVar1 = (dataName->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar1,pcVar1 + dataName->_M_string_length);
  pcVar1 = (originModule->_M_dataplus)._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + originModule->_M_string_length);
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_170,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  iVar3 = -1;
  if (bVar2) {
    pcVar1 = (dataName->_M_dataplus)._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar1,pcVar1 + dataName->_M_string_length);
    pcVar1 = (originModule->_M_dataplus)._M_p;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar1,pcVar1 + originModule->_M_string_length);
    MlmWrap::getSubbedHfType(&local_c0,&this->super_MlmWrap,&local_190,&local_1f0);
    MlmWrap::removeSubFromList(&this->super_MlmWrap,&local_c0);
    HighFreqDataType::~HighFreqDataType(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (dataName->_M_dataplus)._M_p;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar1,pcVar1 + dataName->_M_string_length);
    pcVar1 = (originModule->_M_dataplus)._M_p;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar1,pcVar1 + originModule->_M_string_length);
    MlmWrap::getSubbedHfType(&local_150,&this->super_MlmWrap,&local_1b0,&local_210);
    iVar3 = MlmWrap::removeHfTypeFromSubbedList(&this->super_MlmWrap,&local_150);
    HighFreqDataType::~HighFreqDataType(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar3;
}

Assistant:

int AbstractModuleClient::unsubscribeHighFreqData(std::string dataName, std::string originModule) {
//    std::cout << "mlmWrap: Unsubscribing from [" << dataName << "-" << originModule <<"]\n";
    int retval = -1;
    if (isHfTypeCurrentlySubbed(dataName, originModule)) {
        removeSubFromList(getSubbedHfType(dataName, originModule));
        retval = removeHfTypeFromSubbedList(getSubbedHfType(dataName, originModule));
    }
    return(retval);
}